

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RobSubstitution.cpp
# Opt level: O2

bool __thiscall
Kernel::RobSubstitution::AssocIterator<Kernel::RobSubstitution::UnificationFn>::hasNext
          (AssocIterator<Kernel::RobSubstitution::UnificationFn> *this)

{
  Literal *pLVar1;
  TermList t1;
  Literal *pLVar2;
  TermList t2;
  bool bVar3;
  State SVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (this->_state == FINISHED) {
    return false;
  }
  if (this->_used != true) {
    return true;
  }
  this->_used = false;
  if (this->_state == FIRST) {
    Lib::Stack<Lib::BacktrackData_*>::push
              ((Stack<Lib::BacktrackData_*> *)this->_subst,&this->_bdataEqAssoc);
    bVar3 = UnificationFn::associateEqualitySorts
                      (this->_subst,this->_l1,this->_l1i,this->_l2,this->_l2i);
    if (!bVar3) {
      backtrack(this,&this->_bdataEqAssoc);
      this->_state = FINISHED;
      return false;
    }
  }
  else {
    backtrack(this,&this->_bdataMain);
  }
  Lib::Stack<Lib::BacktrackData_*>::push
            ((Stack<Lib::BacktrackData_*> *)this->_subst,&this->_bdataMain);
  SVar4 = this->_state;
  if (SVar4 == NEXT_CLEANUP) {
LAB_00485bc0:
    backtrack(this,&this->_bdataMain);
    backtrack(this,&this->_bdataEqAssoc);
    SVar4 = FINISHED;
  }
  else if (SVar4 == NEXT_REVERSED) {
LAB_00485b65:
    pLVar1 = this->_l1;
    uVar5 = (ulong)(*(uint *)&(pLVar1->super_Term).field_0xc & 0xfffffff);
    t1._content = (pLVar1->super_Term)._args[uVar5 - 1]._content;
    pLVar2 = this->_l2;
    uVar6 = (ulong)(*(uint *)&(pLVar2->super_Term).field_0xc & 0xfffffff);
    t2._content = (pLVar2->super_Term)._args[uVar6]._content;
    bVar3 = unify(this->_subst,(TermList)(pLVar1->super_Term)._args[uVar5]._content,this->_l1i,
                  (TermList)(pLVar2->super_Term)._args[uVar6 - 1]._content,this->_l2i);
    if ((!bVar3) || (bVar3 = unify(this->_subst,t1,this->_l1i,t2,this->_l2i), !bVar3))
    goto LAB_00485bc0;
    SVar4 = NEXT_CLEANUP;
  }
  else {
    if (SVar4 != FIRST) goto LAB_00485bdd;
    bVar3 = unifyArgs(this->_subst,&this->_l1->super_Term,this->_l1i,&this->_l2->super_Term,
                      this->_l2i);
    if (!bVar3) goto LAB_00485b65;
    SVar4 = NEXT_REVERSED;
  }
  this->_state = SVar4;
LAB_00485bdd:
  return SVar4 != FINISHED;
}

Assistant:

bool hasNext() {
    if (_state == FINISHED) {
      return false;
    }
    if (!_used) {
      return true;
    }
    _used = false;

    if (_state != FIRST) {
      backtrack(_bdataMain);
    } else {
      _subst->bdRecord(_bdataEqAssoc);
      if (!Fn::associateEqualitySorts(_subst, _l1, _l1i, _l2, _l2i)) {
        backtrack(_bdataEqAssoc); // this might not be necessary
        _state = FINISHED;
        return false;
      }
    }

    _subst->bdRecord(_bdataMain);

    switch (_state) {
    case NEXT_STRAIGHT:
      if (Fn::associate(_subst, _l1, _l1i, _l2, _l2i)) {
        _state = NEXT_REVERSED;
        break;
      }
      //no break here intentionally
    case NEXT_REVERSED: {
      TermList t11 = *_l1->nthArgument(0);
      TermList t12 = *_l1->nthArgument(1);
      TermList t21 = *_l2->nthArgument(0);
      TermList t22 = *_l2->nthArgument(1);
      if (Fn::associate(_subst, t11, _l1i, t22, _l2i)) {
        if (Fn::associate(_subst, t12, _l1i, t21, _l2i)) {
          _state = NEXT_CLEANUP;
          break;
        }
        //the first successful association will be undone
        //in case NEXT_CLEANUP
      }
    }
      //no break here intentionally
    case NEXT_CLEANUP:
      //undo the previous match
      backtrack(_bdataMain);
      //undo associateEqualitySorts
      backtrack(_bdataEqAssoc);
      _state = FINISHED;
      break;
    case FINISHED:
      ASSERTION_VIOLATION;
    }
    ASS(_state != FINISHED || (_bdataMain.isEmpty() && _bdataEqAssoc.isEmpty()));
    return _state != FINISHED;
  }